

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# starting_basis.cc
# Opt level: O3

void ipx::StartingBasis(Iterate *iterate,Basis *p_basis,Info *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Model *pMVar4;
  pointer pdVar5;
  double *pdVar6;
  Info *pIVar7;
  iterator iVar8;
  int iVar9;
  double *colscale;
  long lVar10;
  pointer piVar11;
  long lVar12;
  size_t sVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  Int *pIVar17;
  int *piVar18;
  size_t sVar19;
  double dVar20;
  vector<int,_std::allocator<int>_> dependent_rows;
  Vector dxbasic;
  vector<int,_std::allocator<int>_> dependent_cols;
  Vector dy;
  Timer timer;
  int local_b4;
  double *local_b0;
  double *local_a8;
  Info *local_a0;
  vector<int,_std::allocator<int>_> local_98;
  size_t local_80;
  Vector local_78;
  Int *local_68;
  iterator iStack_60;
  int *local_58;
  Vector local_48;
  Timer local_38;
  
  pMVar4 = iterate->model_;
  pdVar14 = (double *)((long)pMVar4->num_cols_ + (long)pMVar4->num_rows_);
  colscale = (double *)operator_new((long)pdVar14 * 8);
  memset(colscale,0,(long)pdVar14 * 8);
  (info->super_ipx_info).errflag = 0;
  Timer::Timer(&local_38);
  local_a8 = pdVar14;
  if (0 < (int)pdVar14) {
    uVar16 = 0;
    do {
      dVar20 = Iterate::ScalingFactor(iterate,(Int)uVar16);
      colscale[uVar16] = dVar20;
      dVar20 = (pMVar4->lb_)._M_data[uVar16];
      pdVar6 = (pMVar4->ub_)._M_data + uVar16;
      if ((dVar20 == *pdVar6) && (!NAN(dVar20) && !NAN(*pdVar6))) {
        colscale[uVar16] = 0.0;
      }
      uVar16 = uVar16 + 1;
    } while (((ulong)pdVar14 & 0xffffffff) != uVar16);
  }
  Basis::ConstructBasisFromWeights(p_basis,colscale,info);
  if ((info->super_ipx_info).errflag == 0) {
    local_a0 = info;
    if (0 < (int)local_a8) {
      uVar16 = (ulong)local_a8 & 0xffffffff;
      uVar15 = 0;
      do {
        if (ABS(colscale[uVar15]) == 0.0 || ABS(colscale[uVar15]) == INFINITY) {
          if ((p_basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15] < 0) {
            Basis::FixNonbasicVariable(p_basis,(Int)uVar15);
          }
          else {
            Basis::FreeBasicVariable(p_basis,(Int)uVar15);
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
      if (0 < (int)local_a8) {
        uVar15 = 0;
        do {
          dVar20 = (pMVar4->lb_)._M_data[uVar15];
          pdVar14 = (pMVar4->ub_)._M_data + uVar15;
          if (((dVar20 == *pdVar14) && (!NAN(dVar20) && !NAN(*pdVar14))) &&
             ((p_basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15] < -1)) {
            Iterate::make_fixed(iterate,(Int)uVar15,dVar20);
          }
          uVar15 = uVar15 + 1;
        } while (uVar16 != uVar15);
      }
    }
    pMVar4 = iterate->model_;
    iVar9 = pMVar4->num_rows_;
    sVar19 = (size_t)iVar9;
    iVar1 = pMVar4->num_cols_;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_58 = (int *)0x0;
    local_68 = (Int *)0x0;
    iStack_60._M_current = (Int *)0x0;
    uVar16 = (long)(iVar9 + iVar1) << 3;
    local_b0 = (double *)operator_new(uVar16);
    memset(local_b0,0,uVar16);
    local_80 = sVar19 * 8;
    local_48._M_size = sVar19;
    pdVar14 = (double *)operator_new(local_80);
    local_48._M_data = pdVar14;
    memset(pdVar14,0,local_80);
    local_a8 = pdVar14;
    if (0 < (local_a0->super_ipx_info).dependent_cols) {
      local_78._M_size = sVar19;
      local_78._M_data = (double *)operator_new(local_80);
      memset(local_78._M_data,0,local_80);
      local_b4 = 0;
      if (0 < iVar1) {
        do {
          lVar10 = (long)local_b4;
          if (((ABS((pMVar4->lb_)._M_data[lVar10]) == INFINITY) &&
              (ABS((pMVar4->ub_)._M_data[lVar10]) == INFINITY)) &&
             ((p_basis->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] < 0)) {
            pdVar14 = (iterate->x_)._M_data;
            local_b0[lVar10] = -pdVar14[lVar10];
            piVar11 = (pMVar4->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar2 = piVar11[lVar10];
            lVar12 = (long)iVar2;
            iVar3 = piVar11[lVar10 + 1];
            if (iVar2 < iVar3) {
              dVar20 = pdVar14[lVar10];
              piVar11 = (pMVar4->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar5 = (pMVar4->AI_).values_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              do {
                iVar2 = piVar11[lVar12];
                local_78._M_data[iVar2] = pdVar5[lVar12] * dVar20 + local_78._M_data[iVar2];
                lVar12 = lVar12 + 1;
              } while (iVar3 != lVar12);
            }
            if (iStack_60._M_current == local_58) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_68,iStack_60,&local_b4);
            }
            else {
              *iStack_60._M_current = local_b4;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
          }
          local_b4 = local_b4 + 1;
        } while (local_b4 < iVar1);
      }
      Basis::SolveDense(p_basis,&local_78,&local_78,'N');
      pdVar14 = local_a8;
      if (0 < iVar9) {
        piVar11 = (p_basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar13 = 0;
        do {
          local_b0[piVar11[sVar13]] = local_78._M_data[sVar13];
          sVar13 = sVar13 + 1;
        } while (sVar19 != sVar13);
      }
      operator_delete(local_78._M_data);
    }
    if (0 < (local_a0->super_ipx_info).dependent_rows) {
      if (0 < iVar9) {
        sVar13 = 0;
        do {
          iVar9 = (p_basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar13];
          if (iVar1 <= iVar9) {
            dVar20 = (pMVar4->lb_)._M_data[iVar9];
            pdVar14 = (pMVar4->ub_)._M_data + iVar9;
            if ((dVar20 == *pdVar14) && (!NAN(dVar20) && !NAN(*pdVar14))) {
              iVar9 = iVar9 - iVar1;
              local_a8[sVar13] = -(iterate->y_)._M_data[iVar9];
              local_78._M_size = CONCAT44(local_78._M_size._4_4_,iVar9);
              if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_98,
                           (iterator)
                           local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_78);
              }
              else {
                *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar9;
                local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          sVar13 = sVar13 + 1;
        } while (sVar19 != sVar13);
      }
      Basis::SolveDense(p_basis,&local_48,&local_48,'T');
      pdVar14 = local_48._M_data;
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        pdVar6 = (iterate->y_)._M_data;
        piVar11 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_48._M_data[*piVar11] = -pdVar6[*piVar11];
          piVar11 = piVar11 + 1;
        } while (piVar11 !=
                 local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
    }
    pIVar7 = local_a0;
    Iterate::Update(iterate,1.0,local_b0,(double *)0x0,(double *)0x0,1.0,pdVar14,(double *)0x0,
                    (double *)0x0);
    iVar8._M_current = iStack_60._M_current;
    for (pIVar17 = local_68;
        piVar11 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        piVar18 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start, pIVar17 != iVar8._M_current;
        pIVar17 = pIVar17 + 1) {
      Iterate::make_fixed(iterate,*pIVar17,0.0);
    }
    for (; piVar18 != piVar11; piVar18 = piVar18 + 1) {
      Iterate::make_implied_eq(iterate,*piVar18 + iVar1);
    }
    operator_delete(local_48._M_data);
    operator_delete(local_b0);
    if (local_68 != (Int *)0x0) {
      operator_delete(local_68);
    }
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Basis::model(p_basis);
    dVar20 = Timer::Elapsed(&local_38);
    (pIVar7->super_ipx_info).time_starting_basis =
         dVar20 + (pIVar7->super_ipx_info).time_starting_basis;
  }
  operator_delete(colscale);
  return;
}

Assistant:

void StartingBasis(Iterate* iterate, Basis* p_basis, Info* info) {
    const Model& model = iterate->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    Vector colscale(n+m);
    Basis& basis = *p_basis;
    info->errflag = 0;
    Timer timer;

    // Construct starting basis. The column weights for the crash procedure are
    // the interior point scaling factors from the current iterate, except that
    // fixed variables get weight zero.
    for (Int j = 0; j < n+m; j++) {
        colscale[j] = iterate->ScalingFactor(j);
        if (std::isinf(lb[j]) && std::isinf(ub[j]))
            assert(colscale[j] == INFINITY);
        else
            assert(std::isfinite(colscale[j]));
        if (lb[j] == ub[j])
            colscale[j] = 0.0;
    }
    basis.ConstructBasisFromWeights(&colscale[0], info);
    if (info->errflag)
        return;

    // Change status of free variables either to BASIC_FREE or NONBASIC_FIXED.
    // Change status of fixed variables either to NONBASIC_FIXED or BASIC_FREE.
    for (Int j = 0; j < n+m; j++) {
        if (colscale[j] == 0.0 || std::isinf(colscale[j])) {
            if (basis.IsBasic(j))
                basis.FreeBasicVariable(j);
            else
                basis.FixNonbasicVariable(j);
        }
    }

    // Variables with equal lower and upper bounds can be removed from the
    // interior point solve if their basic status is NONBASIC_FIXED. Setting
    // x[j] to its bound alters the residual in AI*x=b; this can be ignored
    // because the iterate has not been primal feasible if x[j] was
    // significantly away from its bound.
    for (Int j = 0; j < n+m; j++) {
        if (lb[j] == ub[j] && basis.StatusOf(j) == Basis::NONBASIC_FIXED)
            iterate->make_fixed(j, lb[j]);
    }

    // Linearly dependent rows and columns require adjusting the iterate.
    PostprocessDependencies(iterate, p_basis, info);

    AssertConsistency(*iterate, basis);
    info->time_starting_basis += timer.Elapsed();
}